

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *o,Molecule *mol)

{
  ostream *poVar1;
  
  std::endl<char,std::char_traits<char>>(o);
  poVar1 = std::operator<<(o,"Molecule ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,mol->globalIndex_);
  poVar1 = std::operator<<(poVar1,"has: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," atoms");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," bonds");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," bends");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," torsions");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," inversions");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," rigid bodies");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," integrable objects");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," cutoff groups");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," constraint pairs");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  poVar1 = std::operator<<(poVar1," fluctuating charges");
  std::endl<char,std::char_traits<char>>(poVar1);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, Molecule& mol) {
    o << std::endl;
    o << "Molecule " << mol.getGlobalIndex() << "has: " << std::endl;
    o << mol.getNAtoms() << " atoms" << std::endl;
    o << mol.getNBonds() << " bonds" << std::endl;
    o << mol.getNBends() << " bends" << std::endl;
    o << mol.getNTorsions() << " torsions" << std::endl;
    o << mol.getNInversions() << " inversions" << std::endl;
    o << mol.getNRigidBodies() << " rigid bodies" << std::endl;
    o << mol.getNIntegrableObjects() << " integrable objects" << std::endl;
    o << mol.getNCutoffGroups() << " cutoff groups" << std::endl;
    o << mol.getNConstraintPairs() << " constraint pairs" << std::endl;
    o << mol.getNFluctuatingCharges() << " fluctuating charges" << std::endl;
    return o;
  }